

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set.h
# Opt level: O0

anon_class_8_1_736c71da
google::protobuf::internal::ExtensionSet::
ForEach<std::_Rb_tree_iterator<std::pair<int_const,google::protobuf::internal::ExtensionSet::Extension>>,google::protobuf::internal::ExtensionSet::MessageSetByteSize()const::__0>
          (_Rb_tree_iterator<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_>
           begin,_Rb_tree_iterator<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_>
                 end,anon_class_8_1_736c71da func)

{
  bool bVar1;
  pointer ppVar2;
  anon_class_8_1_736c71da *in_RDX;
  _Self in_RDI;
  _Rb_tree_iterator<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_> it;
  undefined4 in_stack_ffffffffffffffd0;
  int iVar3;
  _Self local_18 [3];
  
  while( true ) {
    bVar1 = std::operator!=((_Self *)&stack0xffffffffffffffd8,local_18);
    if (!bVar1) break;
    ppVar2 = std::
             _Rb_tree_iterator<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_>
             ::operator->((_Rb_tree_iterator<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_>
                           *)0x4a320c);
    iVar3 = ppVar2->first;
    std::
    _Rb_tree_iterator<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_>::
    operator->((_Rb_tree_iterator<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_>
                *)0x4a321c);
    MessageSetByteSize::anon_class_8_1_736c71da::operator()
              (in_RDX,(int)((ulong)in_RDI._M_node >> 0x20),
               (Extension *)CONCAT44(iVar3,in_stack_ffffffffffffffd0));
    std::
    _Rb_tree_iterator<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_>::
    operator++((_Rb_tree_iterator<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_>
                *)CONCAT44(iVar3,in_stack_ffffffffffffffd0));
  }
  return (anon_class_8_1_736c71da)(size_t *)in_RDX;
}

Assistant:

static KeyValueFunctor ForEach(Iterator begin, Iterator end,
                                 KeyValueFunctor func) {
    for (Iterator it = begin; it != end; ++it) func(it->first, it->second);
    return std::move(func);
  }